

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase327::run(TestCase327 *this)

{
  StructBuilder builder_00;
  StructBuilder builder_01;
  StructReader reader;
  StructReader reader_00;
  SegmentBuilder *segment_00;
  size_t sVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  word *location;
  AllocateResult AVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  undefined8 in_stack_fffffffffffffac0;
  undefined8 in_stack_fffffffffffffac8;
  PointerReader local_408;
  StructReader local_3e8;
  StructReader local_3b8;
  SegmentBuilder *local_388;
  SegmentBuilder *pSStack_380;
  CapTableBuilder *local_378;
  void *pvStack_370;
  WirePointer *local_368;
  size_t local_360;
  uint local_358;
  bool local_351;
  size_t sStack_350;
  bool _kj_shouldLog_14;
  uint local_348;
  bool local_341;
  size_t sStack_340;
  bool _kj_shouldLog_13;
  uint local_338;
  bool local_331;
  size_t sStack_330;
  bool _kj_shouldLog_12;
  uint local_328;
  bool local_321;
  size_t sStack_320;
  bool _kj_shouldLog_11;
  uint local_318;
  bool local_311;
  size_t sStack_310;
  bool _kj_shouldLog_10;
  uint local_308;
  bool local_301;
  size_t sStack_300;
  bool _kj_shouldLog_9;
  uint local_2f8;
  bool local_2f1;
  size_t sStack_2f0;
  bool _kj_shouldLog_8;
  uint local_2e8;
  bool local_2e1;
  size_t sStack_2e0;
  bool _kj_shouldLog_7;
  uint local_2d8;
  bool local_2d1;
  size_t sStack_2d0;
  bool _kj_shouldLog_6;
  uint local_2c8;
  bool local_2c1;
  size_t sStack_2c0;
  bool _kj_shouldLog_5;
  uint local_2b8;
  bool local_2b1;
  size_t sStack_2b0;
  bool _kj_shouldLog_4;
  uint local_2a8;
  bool local_2a1;
  size_t sStack_2a0;
  bool _kj_shouldLog_3;
  uint local_298;
  bool local_291;
  size_t sStack_290;
  bool _kj_shouldLog_2;
  uint local_288;
  bool local_281;
  size_t sStack_280;
  bool _kj_shouldLog_1;
  uint local_278;
  bool local_271;
  size_t sStack_270;
  bool _kj_shouldLog;
  uint local_264;
  Fault local_260;
  Fault f;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  StructSize local_214;
  PointerBuilder local_210;
  undefined1 auStack_1f8 [8];
  StructBuilder builder;
  word *rootLocation;
  SegmentBuilder *segment;
  AllocateResult allocation;
  undefined1 local_1a0 [8];
  BuilderArena arena;
  MallocMessageBuilder message;
  TestCase327 *this_local;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&arena.segmentWithSpace,0,FIXED_SIZE);
  BuilderArena::BuilderArena((BuilderArena *)local_1a0,(MessageBuilder *)&arena.segmentWithSpace);
  AVar3 = BuilderArena::allocate((BuilderArena *)local_1a0,1);
  builder._32_8_ = AVar3.words;
  segment_00 = AVar3.segment;
  PointerBuilder::getRoot(&local_210,segment_00,(CapTableBuilder *)0x0,(word *)builder._32_8_);
  StructSize::StructSize(&local_214,2,4);
  PointerBuilder::initStruct((StructBuilder *)auStack_1f8,&local_210,local_214);
  builder_00.capTable = builder.capTable;
  builder_00.segment = builder.segment;
  builder_00.data = builder.data;
  builder_00.pointers = builder.pointers;
  builder_00.dataSize = (int)in_stack_fffffffffffffac0;
  builder_00.pointerCount = (short)((ulong)in_stack_fffffffffffffac0 >> 0x20);
  builder_00._38_2_ = (short)((ulong)in_stack_fffffffffffffac0 >> 0x30);
  setupStruct(builder_00);
  AVar4 = BuilderArena::getSegmentsForOutput((BuilderArena *)local_1a0);
  f.exception = (Exception *)AVar4.ptr;
  sVar1 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f);
  if (sVar1 != 0xf) {
    local_264 = 0xf;
    sStack_270 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                           ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_long>
              (&local_260,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x154,FAILED,"(15u) == (segments.size())","15u, segments.size()",&local_264,
               &stack0xfffffffffffffd90);
    kj::_::Debug::Fault::fatal(&local_260);
  }
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,0);
  sVar1 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
  if (sVar1 != 1) {
    local_271 = kj::_::Debug::shouldLog(ERROR);
    while (local_271 != false) {
      local_278 = 1;
      pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,0);
      sStack_280 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x158,ERROR,
                 "\"failed: expected \" \"(1u) == (segments[ 0].size())\", 1u, segments[ 0].size()",
                 (char (*) [47])"failed: expected (1u) == (segments[ 0].size())",&local_278,
                 &stack0xfffffffffffffd80);
      local_271 = false;
    }
  }
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,1);
  sVar1 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
  if (sVar1 != 7) {
    local_281 = kj::_::Debug::shouldLog(ERROR);
    while (local_281 != false) {
      local_288 = 7;
      pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,1);
      sStack_290 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x159,ERROR,
                 "\"failed: expected \" \"(7u) == (segments[ 1].size())\", 7u, segments[ 1].size()",
                 (char (*) [47])"failed: expected (7u) == (segments[ 1].size())",&local_288,
                 &stack0xfffffffffffffd70);
      local_281 = false;
    }
  }
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,2);
  sVar1 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
  if (sVar1 != 2) {
    local_291 = kj::_::Debug::shouldLog(ERROR);
    while (local_291 != false) {
      local_298 = 2;
      pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,2);
      sStack_2a0 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x15a,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[ 2].size())\", 2u, segments[ 2].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[ 2].size())",&local_298,
                 &stack0xfffffffffffffd60);
      local_291 = false;
    }
  }
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,3);
  sVar1 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
  if (sVar1 != 3) {
    local_2a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2a1 != false) {
      local_2a8 = 3;
      pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,3);
      sStack_2b0 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x15b,ERROR,
                 "\"failed: expected \" \"(3u) == (segments[ 3].size())\", 3u, segments[ 3].size()",
                 (char (*) [47])"failed: expected (3u) == (segments[ 3].size())",&local_2a8,
                 &stack0xfffffffffffffd50);
      local_2a1 = false;
    }
  }
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,4);
  sVar1 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
  if (sVar1 != 10) {
    local_2b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2b1 != false) {
      local_2b8 = 10;
      pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,4);
      sStack_2c0 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
      kj::_::Debug::log<char_const(&)[48],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x15c,ERROR,
                 "\"failed: expected \" \"(10u) == (segments[ 4].size())\", 10u, segments[ 4].size()"
                 ,(char (*) [48])"failed: expected (10u) == (segments[ 4].size())",&local_2b8,
                 &stack0xfffffffffffffd40);
      local_2b1 = false;
    }
  }
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,5);
  sVar1 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
  if (sVar1 != 2) {
    local_2c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2c1 != false) {
      local_2c8 = 2;
      pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,5);
      sStack_2d0 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x15d,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[ 5].size())\", 2u, segments[ 5].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[ 5].size())",&local_2c8,
                 &stack0xfffffffffffffd30);
      local_2c1 = false;
    }
  }
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,6);
  sVar1 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
  if (sVar1 != 2) {
    local_2d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2d1 != false) {
      local_2d8 = 2;
      pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,6);
      sStack_2e0 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x15e,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[ 6].size())\", 2u, segments[ 6].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[ 6].size())",&local_2d8,
                 &stack0xfffffffffffffd20);
      local_2d1 = false;
    }
  }
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,7);
  sVar1 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
  if (sVar1 != 2) {
    local_2e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2e1 != false) {
      local_2e8 = 2;
      pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,7);
      sStack_2f0 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x15f,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[ 7].size())\", 2u, segments[ 7].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[ 7].size())",&local_2e8,
                 &stack0xfffffffffffffd10);
      local_2e1 = false;
    }
  }
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,8);
  sVar1 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
  if (sVar1 != 2) {
    local_2f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2f1 != false) {
      local_2f8 = 2;
      pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,8);
      sStack_300 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x160,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[ 8].size())\", 2u, segments[ 8].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[ 8].size())",&local_2f8,
                 &stack0xfffffffffffffd00);
      local_2f1 = false;
    }
  }
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,9);
  sVar1 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
  if (sVar1 != 6) {
    local_301 = kj::_::Debug::shouldLog(ERROR);
    while (local_301 != false) {
      local_308 = 6;
      pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,9);
      sStack_310 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x161,ERROR,
                 "\"failed: expected \" \"(6u) == (segments[ 9].size())\", 6u, segments[ 9].size()",
                 (char (*) [47])"failed: expected (6u) == (segments[ 9].size())",&local_308,
                 &stack0xfffffffffffffcf0);
      local_301 = false;
    }
  }
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,10);
  sVar1 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
  if (sVar1 != 2) {
    local_311 = kj::_::Debug::shouldLog(ERROR);
    while (local_311 != false) {
      local_318 = 2;
      pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,10);
      sStack_320 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x162,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[10].size())\", 2u, segments[10].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[10].size())",&local_318,
                 &stack0xfffffffffffffce0);
      local_311 = false;
    }
  }
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,0xb);
  sVar1 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
  if (sVar1 != 2) {
    local_321 = kj::_::Debug::shouldLog(ERROR);
    while (local_321 != false) {
      local_328 = 2;
      pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,0xb);
      sStack_330 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x163,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[11].size())\", 2u, segments[11].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[11].size())",&local_328,
                 &stack0xfffffffffffffcd0);
      local_321 = false;
    }
  }
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,0xc);
  sVar1 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
  if (sVar1 != 2) {
    local_331 = kj::_::Debug::shouldLog(ERROR);
    while (local_331 != false) {
      local_338 = 2;
      pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,0xc);
      sStack_340 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x164,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[12].size())\", 2u, segments[12].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[12].size())",&local_338,
                 &stack0xfffffffffffffcc0);
      local_331 = false;
    }
  }
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,0xd);
  sVar1 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
  if (sVar1 != 2) {
    local_341 = kj::_::Debug::shouldLog(ERROR);
    while (local_341 != false) {
      local_348 = 2;
      pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,0xd);
      sStack_350 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x165,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[13].size())\", 2u, segments[13].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[13].size())",&local_348,
                 &stack0xfffffffffffffcb0);
      local_341 = false;
    }
  }
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,0xe);
  sVar1 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
  if (sVar1 != 3) {
    local_351 = kj::_::Debug::shouldLog(ERROR);
    while (local_351 != false) {
      local_358 = 3;
      pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,0xe);
      local_360 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x166,ERROR,
                 "\"failed: expected \" \"(3u) == (segments[14].size())\", 3u, segments[14].size()",
                 (char (*) [47])"failed: expected (3u) == (segments[14].size())",&local_358,
                 &local_360);
      local_351 = false;
    }
  }
  local_368 = builder.pointers;
  local_378 = builder.capTable;
  pvStack_370 = builder.data;
  local_388 = (SegmentBuilder *)auStack_1f8;
  pSStack_380 = builder.segment;
  builder_01.capTable = builder.capTable;
  builder_01.segment = builder.segment;
  builder_01.data = builder.data;
  builder_01.pointers = builder.pointers;
  builder_01.dataSize = (int)in_stack_fffffffffffffac0;
  builder_01.pointerCount = (short)((ulong)in_stack_fffffffffffffac0 >> 0x20);
  builder_01._38_2_ = (short)((ulong)in_stack_fffffffffffffac0 >> 0x30);
  checkStruct(builder_01);
  StructBuilder::asReader(&local_3b8,(StructBuilder *)auStack_1f8);
  reader.capTable = (CapTableReader *)local_3b8.data;
  reader.segment = (SegmentReader *)local_3b8.capTable;
  reader.data = local_3b8.pointers;
  reader.pointers = (WirePointer *)local_3b8._32_8_;
  reader.dataSize = local_3b8.nestingLimit;
  reader.pointerCount = local_3b8._44_2_;
  reader._38_2_ = local_3b8._46_2_;
  reader._40_8_ = in_stack_fffffffffffffac8;
  checkStruct(reader);
  location = SegmentReader::getStartPtr(&segment_00->super_SegmentReader);
  PointerReader::getRoot
            (&local_408,&segment_00->super_SegmentReader,(CapTableReader *)0x0,location,4);
  PointerReader::getStruct(&local_3e8,&local_408,(word *)0x0);
  reader_00.capTable = (CapTableReader *)local_3e8.data;
  reader_00.segment = (SegmentReader *)local_3e8.capTable;
  reader_00.data = local_3e8.pointers;
  reader_00.pointers = (WirePointer *)local_3e8._32_8_;
  reader_00.dataSize = local_3e8.nestingLimit;
  reader_00.pointerCount = local_3e8._44_2_;
  reader_00._38_2_ = local_3e8._46_2_;
  reader_00._40_8_ = in_stack_fffffffffffffac8;
  checkStruct(reader_00);
  BuilderArena::~BuilderArena((BuilderArena *)local_1a0);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&arena.segmentWithSpace);
  return;
}

Assistant:

TEST(WireFormat, StructRoundTrip_OneSegmentPerAllocation) {
  MallocMessageBuilder message(0, AllocationStrategy::FIXED_SIZE);
  BuilderArena arena(&message);
  auto allocation = arena.allocate(1 * WORDS);
  SegmentBuilder* segment = allocation.segment;
  word* rootLocation = allocation.words;

  StructBuilder builder = PointerBuilder::getRoot(segment, nullptr, rootLocation)
      .initStruct(StructSize(2 * WORDS, 4 * POINTERS));
  setupStruct(builder);

  // Verify that we made 15 segments.
  kj::ArrayPtr<const kj::ArrayPtr<const word>> segments = arena.getSegmentsForOutput();
  ASSERT_EQ(15u, segments.size());

  // Check that each segment has the expected size.  Recall that the first word of each segment will
  // actually be a pointer to the first thing allocated within that segment.
  EXPECT_EQ( 1u, segments[ 0].size());  // root ref
  EXPECT_EQ( 7u, segments[ 1].size());  // root struct
  EXPECT_EQ( 2u, segments[ 2].size());  // sub-struct
  EXPECT_EQ( 3u, segments[ 3].size());  // 3-element int32 list
  EXPECT_EQ(10u, segments[ 4].size());  // struct list
  EXPECT_EQ( 2u, segments[ 5].size());  // struct list substruct 1
  EXPECT_EQ( 2u, segments[ 6].size());  // struct list substruct 2
  EXPECT_EQ( 2u, segments[ 7].size());  // struct list substruct 3
  EXPECT_EQ( 2u, segments[ 8].size());  // struct list substruct 4
  EXPECT_EQ( 6u, segments[ 9].size());  // list list
  EXPECT_EQ( 2u, segments[10].size());  // list list sublist 1
  EXPECT_EQ( 2u, segments[11].size());  // list list sublist 2
  EXPECT_EQ( 2u, segments[12].size());  // list list sublist 3
  EXPECT_EQ( 2u, segments[13].size());  // list list sublist 4
  EXPECT_EQ( 3u, segments[14].size());  // list list sublist 5

  checkStruct(builder);
  checkStruct(builder.asReader());
  checkStruct(PointerReader::getRoot(segment, nullptr, segment->getStartPtr(), 4)
      .getStruct(nullptr));
}